

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  long lVar1;
  void *pvVar2;
  Pager *pPVar3;
  LookasideSlot *pLVar4;
  LookasideSlot *pLVar5;
  Schema *pSVar6;
  _ht *p_Var7;
  uint uVar8;
  Btree **ppBVar9;
  int iVar10;
  LookasideSlot *pLVar11;
  long lVar12;
  Vdbe *p;
  int iVar13;
  HashElem *pHVar14;
  long lVar15;
  int nByte_1;
  int nByte;
  uint local_58;
  int local_54;
  int *local_50;
  int local_44;
  int local_40;
  uint local_3c;
  int *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  switch(op) {
  case 0:
    iVar13 = sqlite3LookasideUsed(db,pHighwater);
    *pCurrent = iVar13;
    iVar13 = 0;
    if (resetFlag != 0) {
      pLVar4 = (db->lookaside).pFree;
      pLVar5 = pLVar4;
      if (pLVar4 != (LookasideSlot *)0x0) {
        do {
          pLVar11 = pLVar5;
          pLVar5 = pLVar11->pNext;
        } while (pLVar5 != (LookasideSlot *)0x0);
        pLVar11->pNext = (db->lookaside).pInit;
        (db->lookaside).pInit = pLVar4;
        (db->lookaside).pFree = (LookasideSlot *)0x0;
      }
      pLVar4 = (db->lookaside).pSmallFree;
      pLVar5 = pLVar4;
      if (pLVar4 != (LookasideSlot *)0x0) {
        do {
          pLVar11 = pLVar5;
          pLVar5 = pLVar11->pNext;
        } while (pLVar5 != (LookasideSlot *)0x0);
        pLVar11->pNext = (db->lookaside).pSmallInit;
        (db->lookaside).pSmallInit = pLVar4;
        (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
      }
    }
    break;
  case 1:
  case 0xb:
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    local_38 = pCurrent;
    if (db->nDb < 1) {
      iVar13 = 0;
      local_50 = pHighwater;
    }
    else {
      lVar15 = 0;
      lVar12 = 8;
      iVar13 = 0;
      local_50 = pHighwater;
      local_44 = op;
      do {
        lVar1 = *(long *)((long)&db->aDb->zDbSName + lVar12);
        if (lVar1 != 0) {
          pvVar2 = (void *)**(undefined8 **)(lVar1 + 8);
          local_40 = *(int *)((long)pvVar2 + 200) + 0x70 + (uint)*(ushort *)((long)pvVar2 + 0xb0);
          local_54 = iVar13;
          iVar13 = (*sqlite3Config.pcache2.xPagecount)
                             (*(sqlite3_pcache **)(*(long *)((long)pvVar2 + 0x120) + 0x40));
          iVar13 = iVar13 * local_40;
          iVar10 = (*sqlite3Config.m.xSize)(pvVar2);
          iVar13 = iVar10 + iVar13 + *(int *)((long)pvVar2 + 200);
          if (local_44 == 0xb) {
            iVar13 = iVar13 / *(int *)(*(long *)(lVar1 + 8) + 0x68);
          }
          iVar13 = local_54 + iVar13;
        }
        lVar15 = lVar15 + 1;
        lVar12 = lVar12 + 0x20;
      } while (lVar15 < db->nDb);
    }
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    *local_38 = iVar13;
    *local_50 = 0;
    goto LAB_00131b3e;
  case 2:
    local_58 = 0;
    local_50 = pHighwater;
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    db->pnBytesFreed = (int *)&local_58;
    (db->lookaside).pEnd = (db->lookaside).pStart;
    if (0 < db->nDb) {
      lVar12 = 0;
      do {
        pSVar6 = db->aDb[lVar12].pSchema;
        if (pSVar6 != (Schema *)0x0) {
          iVar13 = (*sqlite3Config.m.xRoundup)(0x20);
          local_58 = local_58 +
                     ((pSVar6->trigHash).count + (pSVar6->tblHash).count + (pSVar6->idxHash).count +
                     (pSVar6->fkeyHash).count) * iVar13;
          p_Var7 = (pSVar6->tblHash).ht;
          iVar10 = 0;
          iVar13 = 0;
          if (p_Var7 != (_ht *)0x0) {
            iVar13 = (*sqlite3Config.m.xSize)(p_Var7);
          }
          local_58 = local_58 + iVar13;
          p_Var7 = (pSVar6->trigHash).ht;
          if (p_Var7 != (_ht *)0x0) {
            iVar10 = (*sqlite3Config.m.xSize)(p_Var7);
          }
          local_58 = local_58 + iVar10;
          p_Var7 = (pSVar6->idxHash).ht;
          iVar10 = 0;
          iVar13 = 0;
          if (p_Var7 != (_ht *)0x0) {
            iVar13 = (*sqlite3Config.m.xSize)(p_Var7);
          }
          local_58 = local_58 + iVar13;
          p_Var7 = (pSVar6->fkeyHash).ht;
          if (p_Var7 != (_ht *)0x0) {
            iVar10 = (*sqlite3Config.m.xSize)(p_Var7);
          }
          local_58 = local_58 + iVar10;
          for (pHVar14 = (pSVar6->trigHash).first; pHVar14 != (HashElem *)0x0;
              pHVar14 = pHVar14->next) {
            sqlite3DeleteTrigger(db,(Trigger *)pHVar14->data);
          }
          for (pHVar14 = (pSVar6->tblHash).first; pHVar14 != (HashElem *)0x0;
              pHVar14 = pHVar14->next) {
            sqlite3DeleteTable(db,(Table *)pHVar14->data);
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < db->nDb);
    }
    db->pnBytesFreed = (int *)0x0;
    (db->lookaside).pEnd = (db->lookaside).pTrueEnd;
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    *local_50 = 0;
    uVar8 = local_58;
    goto LAB_00131b0e;
  case 3:
    local_3c = 0;
    db->pnBytesFreed = (int *)&local_3c;
    p = db->pVdbe;
    (db->lookaside).pEnd = (db->lookaside).pStart;
    for (; p != (Vdbe *)0x0; p = p->pVNext) {
      sqlite3VdbeDelete(p);
    }
    (db->lookaside).pEnd = (db->lookaside).pTrueEnd;
    db->pnBytesFreed = (int *)0x0;
    *pHighwater = 0;
    uVar8 = local_3c;
    goto LAB_00131b0e;
  case 4:
  case 5:
  case 6:
    *pCurrent = 0;
    *pHighwater = (db->lookaside).anStat[(long)op + -4];
    iVar13 = 0;
    if (resetFlag != 0) {
      (db->lookaside).anStat[(long)op + -4] = 0;
    }
    break;
  case 7:
  case 8:
  case 9:
    goto LAB_0013186f;
  case 10:
    *pHighwater = 0;
    uVar8 = 1;
    if (db->nDeferredImmCons < 1) {
      uVar8 = (uint)(0 < db->nDeferredCons);
    }
LAB_00131b0e:
    *pCurrent = uVar8;
LAB_00131b3e:
    iVar13 = 0;
    break;
  case 0xc:
    op = 10;
LAB_0013186f:
    iVar13 = 0;
    iVar10 = 0;
    if (0 < db->nDb) {
      ppBVar9 = &db->aDb->pBt;
      lVar12 = 0;
      iVar10 = 0;
      do {
        if (*ppBVar9 != (Btree *)0x0) {
          pPVar3 = (*ppBVar9)->pBt->pPager;
          iVar10 = iVar10 + pPVar3->aStat[op + -7];
          if (resetFlag != 0) {
            pPVar3->aStat[op + -7] = 0;
          }
        }
        lVar12 = lVar12 + 1;
        ppBVar9 = ppBVar9 + 4;
      } while (lVar12 < db->nDb);
    }
    *pHighwater = 0;
    *pCurrent = iVar10;
    break;
  default:
    iVar13 = 1;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar13;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pCurrent==0|| pHighwater==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = sqlite3LookasideUsed(db, pHighwater);
      if( resetFlag ){
        LookasideSlot *p = db->lookaside.pFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pInit;
          db->lookaside.pInit = db->lookaside.pFree;
          db->lookaside.pFree = 0;
        }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
        p = db->lookaside.pSmallFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pSmallInit;
          db->lookaside.pSmallInit = db->lookaside.pSmallFree;
          db->lookaside.pSmallFree = 0;
        }
#endif
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /*
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED_SHARED:
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          int nByte = sqlite3PagerMemUsed(pPager);
          if( op==SQLITE_DBSTATUS_CACHE_USED_SHARED ){
            nByte = nByte / sqlite3BtreeConnectionCount(pBt);
          }
          totalUsed += nByte;
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3_msize(pSchema->tblHash.ht);
          nByte += sqlite3_msize(pSchema->trigHash.ht);
          nByte += sqlite3_msize(pSchema->idxHash.ht);
          nByte += sqlite3_msize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pVNext){
        sqlite3VdbeDelete(pVdbe);
      }
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      db->pnBytesFreed = 0;

      *pHighwater = 0;  /* IMP: R-64479-57858 */
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_SPILL:
      op = SQLITE_DBSTATUS_CACHE_WRITE+1;
      /* no break */ deliberate_fall_through
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      int nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0; /* IMP: R-42420-56072 */
                       /* IMP: R-54100-20147 */
                       /* IMP: R-29431-39229 */
      *pCurrent = nRet;
      break;
    }

    /* Set *pCurrent to non-zero if there are unresolved deferred foreign
    ** key constraints.  Set *pCurrent to zero if all foreign key constraints
    ** have been satisfied.  The *pHighwater is always set to zero.
    */
    case SQLITE_DBSTATUS_DEFERRED_FKS: {
      *pHighwater = 0;  /* IMP: R-11967-56545 */
      *pCurrent = db->nDeferredImmCons>0 || db->nDeferredCons>0;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}